

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::dxt_hc::color_cluster>::clear(vector<crnlib::dxt_hc::color_cluster> *this)

{
  color_cluster *in_RDI;
  uint in_stack_ffffffffffffffec;
  
  if (in_RDI->blocks[0].m_p != (uint *)0x0) {
    scalar_type<crnlib::dxt_hc::color_cluster>::destruct_array(in_RDI,in_stack_ffffffffffffffec);
    crnlib_free((void *)0x1f7f56);
    in_RDI->blocks[0].m_p = (uint *)0x0;
    in_RDI->blocks[0].m_size = 0;
    in_RDI->blocks[0].m_capacity = 0;
  }
  return;
}

Assistant:

inline void clear() {
    if (m_p) {
      scalar_type<T>::destruct_array(m_p, m_size);
      crnlib_free(m_p);
      m_p = NULL;
      m_size = 0;
      m_capacity = 0;
    }
  }